

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O2

int __thiscall cmCTestUpdateHandler::DetermineType(cmCTestUpdateHandler *this,char *cmd,char *type)

{
  cmCTest *pcVar1;
  ostream *poVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  allocator<char> local_1b9;
  string local_1b8;
  ostringstream cmCTestLog_msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"Determine update type from command: ");
  poVar2 = std::operator<<(poVar2,cmd);
  poVar2 = std::operator<<(poVar2," and type: ");
  poVar2 = std::operator<<(poVar2,type);
  std::endl<char,std::char_traits<char>>(poVar2);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
               ,0x35,local_1b8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  if ((type == (char *)0x0) || (*type == '\0')) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"Type not specified, check command: ");
    poVar2 = std::operator<<(poVar2,cmd);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x4f,local_1b8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,cmd,&local_1b9);
    cmsys::SystemTools::LowerCase((string *)&cmCTestLog_msg,&local_1b8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"Type specified: ");
    poVar2 = std::operator<<(poVar2,type);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x38,local_1b8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,type,&local_1b9);
    cmsys::SystemTools::LowerCase((string *)&cmCTestLog_msg,&local_1b8);
  }
  std::__cxx11::string::~string((string *)&local_1b8);
  bVar5 = false;
  lVar3 = std::__cxx11::string::find((char *)&cmCTestLog_msg,0x786bef);
  if (lVar3 == -1) {
    bVar5 = false;
    lVar3 = std::__cxx11::string::find((char *)&cmCTestLog_msg,0x786dc9);
    if (lVar3 == -1) {
      bVar5 = false;
      lVar3 = std::__cxx11::string::find((char *)&cmCTestLog_msg,0x786dd4);
      if (lVar3 == -1) {
        bVar5 = false;
        lVar3 = std::__cxx11::string::find((char *)&cmCTestLog_msg,0x786dda);
        if (lVar3 == -1) {
          bVar5 = false;
          lVar3 = std::__cxx11::string::find((char *)&cmCTestLog_msg,0x786de0);
          if (lVar3 == -1) {
            lVar3 = std::__cxx11::string::find((char *)&cmCTestLog_msg,0x786de5);
            bVar5 = lVar3 == -1;
            iVar4 = 6;
          }
          else {
            iVar4 = 5;
          }
        }
        else {
          iVar4 = 4;
        }
      }
      else {
        iVar4 = 3;
      }
    }
    else {
      iVar4 = 2;
    }
  }
  else {
    iVar4 = 1;
  }
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (bVar5) {
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int cmCTestUpdateHandler::DetermineType(const char* cmd, const char* type)
{
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Determine update type from command: "
                       << cmd << " and type: " << type << std::endl,
                     this->Quiet);
  if (type && *type) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Type specified: " << type << std::endl, this->Quiet);
    std::string stype = cmSystemTools::LowerCase(type);
    if (stype.find("cvs") != std::string::npos) {
      return cmCTestUpdateHandler::e_CVS;
    }
    if (stype.find("svn") != std::string::npos) {
      return cmCTestUpdateHandler::e_SVN;
    }
    if (stype.find("bzr") != std::string::npos) {
      return cmCTestUpdateHandler::e_BZR;
    }
    if (stype.find("git") != std::string::npos) {
      return cmCTestUpdateHandler::e_GIT;
    }
    if (stype.find("hg") != std::string::npos) {
      return cmCTestUpdateHandler::e_HG;
    }
    if (stype.find("p4") != std::string::npos) {
      return cmCTestUpdateHandler::e_P4;
    }
  } else {
    cmCTestOptionalLog(
      this->CTest, DEBUG,
      "Type not specified, check command: " << cmd << std::endl, this->Quiet);
    std::string stype = cmSystemTools::LowerCase(cmd);
    if (stype.find("cvs") != std::string::npos) {
      return cmCTestUpdateHandler::e_CVS;
    }
    if (stype.find("svn") != std::string::npos) {
      return cmCTestUpdateHandler::e_SVN;
    }
    if (stype.find("bzr") != std::string::npos) {
      return cmCTestUpdateHandler::e_BZR;
    }
    if (stype.find("git") != std::string::npos) {
      return cmCTestUpdateHandler::e_GIT;
    }
    if (stype.find("hg") != std::string::npos) {
      return cmCTestUpdateHandler::e_HG;
    }
    if (stype.find("p4") != std::string::npos) {
      return cmCTestUpdateHandler::e_P4;
    }
  }
  return cmCTestUpdateHandler::e_UNKNOWN;
}